

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O0

void CVmBifTIO::flush_output(uint argc)

{
  vm_nl_type in_EDI;
  undefined4 unaff_retaddr;
  
  CVmBif::check_argc(0,0x303c90);
  CVmConsole::flush((CVmConsole *)CONCAT44(argc,unaff_retaddr),in_EDI);
  CVmConsole::update_display((CVmConsole *)0x303cb0);
  return;
}

Assistant:

void CVmBifTIO::flush_output(VMG_ uint argc)
{
    /* we take no arguments */
    check_argc(vmg_ argc, 0);

    /* flush output */
    G_console->flush(vmg_ VM_NL_NONE);

    /* immediately update the display */
    G_console->update_display(vmg0_);
}